

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::init
          (SymmetricOuterEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar3;
  RenderTarget *pRVar4;
  long *plVar5;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar6;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar7;
  TestError *this_01;
  size_type *psVar8;
  pointer pbVar9;
  Context *code;
  undefined1 in_R9B;
  deInt32 *pdVar10;
  long lVar11;
  string tessellationEvaluationTemplate;
  string fragmentShaderTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  size_type *local_2e0;
  value_type local_2d8;
  size_type *local_2b8;
  value_type local_2b0;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  Context *local_268;
  long local_260;
  undefined1 local_258 [16];
  ContextInfo *local_248;
  long local_240;
  undefined1 local_238 [16];
  pointer local_228;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [16];
  ContextInfo *local_1e8;
  undefined1 local_1d8 [24];
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  uint local_1a8;
  value_type local_1a0;
  value_type local_180;
  string local_160;
  string local_140;
  string local_120;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  deUint32 local_58;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar4->m_width,
             (RenderTarget *)(ulong)(uint)pRVar4->m_height,0x10);
  local_1e8 = (ContextInfo *)local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  local_208._M_allocated_capacity = (size_type)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_218 + 0x10),
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,"");
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_290,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
             this->m_spacing,this->m_winding,(uint)this->m_usePointMode,(bool)in_R9B);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_290,0,(char *)0x0,0x1c4562f);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_2b0._M_string_length = *psVar8;
    local_2b0.field_2._M_allocated_capacity = plVar5[3];
    local_2b8 = &local_2b0._M_string_length;
  }
  else {
    local_2b0._M_string_length = *psVar8;
    local_2b8 = (size_type *)*plVar5;
  }
  local_2b0._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_2d8._M_string_length = *psVar8;
    local_2d8.field_2._M_allocated_capacity = plVar5[3];
    local_2e0 = &local_2d8._M_string_length;
  }
  else {
    local_2d8._M_string_length = *psVar8;
    local_2e0 = (size_type *)*plVar5;
  }
  local_2d8._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  pbVar9 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar9) {
    local_100._16_8_ = (pbVar9->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar5[3];
    local_100._0_8_ = (pointer)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ = (pbVar9->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_268 = (Context *)local_258;
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_258._0_8_ = code->m_testCtx;
    local_258._8_8_ = plVar5[3];
  }
  else {
    local_258._0_8_ = code->m_testCtx;
    local_268 = (Context *)*plVar5;
  }
  local_260 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_2e0 != &local_2d8._M_string_length) {
    operator_delete(local_2e0,local_2d8._M_string_length + 1);
  }
  if (local_2b8 != &local_2b0._M_string_length) {
    operator_delete(local_2b8,local_2b0._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_290._4_4_,local_290._0_4_) != &local_280) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_290._4_4_,local_290._0_4_),local_280._M_allocated_capacity + 1
                   );
  }
  local_228 = (pointer)local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_1d8 + 0x10),(_anonymous_namespace_ *)pCVar2->m_renderCtx,
             (Context *)local_1e8,(char *)code);
  local_2e0 = (size_type *)((ulong)local_2e0 & 0xffffffff00000000);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_1d8._16_8_,
             (char *)(local_1d8._16_8_ + (long)&local_1c0->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2e0 & 0xffffffff) * 0x18),&local_2d8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_208._M_allocated_capacity,(char *)code);
  local_2b8 = (size_type *)CONCAT44(local_2b8._4_4_,3);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2b8 & 0xffffffff) * 0x18),&local_2b0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_268,(char *)code);
  local_290._0_4_ = 4;
  local_290._8_8_ = local_280._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_290 + 8),local_140._M_dataplus._M_p,
             local_140._M_dataplus._M_p + local_140._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)(uint)local_290._0_4_ * 0x18),(value_type *)(local_290 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_228,(char *)code);
  local_1a8 = 1;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_1a8 * 0x18),&local_1a0);
  local_248 = (ContextInfo *)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"out_te_tessCoord_isMirrored","");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_248,
             (undefined1 *)((long)&local_248->_vptr_ContextInfo + local_240));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,&local_180);
  local_58 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_100);
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar6->strongRefCount;
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  pSVar3 = (this->m_program).m_state;
  if (pSVar3 != pSVar6) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar10 = &pSVar3->strongRefCount;
      *pdVar10 = *pdVar10 + -1;
      UNLOCK();
      if (*pdVar10 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar10 = &((this->m_program).m_state)->weakRefCount;
      *pdVar10 = *pdVar10 + -1;
      UNLOCK();
      if (*pdVar10 == 0) {
        pSVar3 = (this->m_program).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar10 = &((this->m_program).m_state)->weakRefCount;
    *pdVar10 = *pdVar10 + 1;
    UNLOCK();
  }
  pdVar10 = &pSVar6->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
  }
  LOCK();
  *pdVar10 = *pdVar10 + -1;
  UNLOCK();
  if (*pdVar10 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (ContextInfo *)local_238) {
    operator_delete(local_248,local_238._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_290._8_8_ != local_280._M_local_buf + 8) {
    operator_delete((void *)local_290._8_8_,local_280._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._16_8_ != &local_1b8) {
    operator_delete((void *)local_1d8._16_8_,local_1b8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_228 != (pointer)local_218) {
      operator_delete(local_228,(ulong)(local_218._0_8_ + 1));
    }
    if (local_268 != (Context *)local_258) {
      operator_delete(local_268,(ulong)((long)(Platform **)local_258._0_8_ + 1));
    }
    if ((ContextInfo *)local_208._M_allocated_capacity != (ContextInfo *)local_1f8) {
      operator_delete((void *)local_208._M_allocated_capacity,
                      (ulong)((long)(Platform **)local_1f8._0_8_ + 1));
    }
    pCVar7 = (ContextInfo *)local_1d8;
    if (local_1e8 != pCVar7) {
      operator_delete(local_1e8,(ulong)((long)(Platform **)local_1d8._0_8_ + 1));
      pCVar7 = extraout_RAX;
    }
    return (int)pCVar7;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x10c6);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SymmetricOuterEdgeCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec4 out_te_tessCoord_isMirrored;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	float z = gl_TessCoord.z;\n"
													"	// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
													"	out_te_tessCoord_isMirrored = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
													"	                            : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
													"	                            : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
													"	                            : vec4(x, y, z, 0.0);\n"
												  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
													"	out_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
													"	                            : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
													"	                            : vec4(x, y, 0.0, 0.0);\n"
												  : m_primitiveType == TESSPRIMITIVETYPE_ISOLINES ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	// Mirror one half of each outer edge onto the other half\n"
													"	out_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
													"	                            : vec4(x, y, 0.0, 0.0f);\n"
												  : DE_NULL) +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_tessCoord_isMirrored")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}